

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O1

void * pipe_new(t_symbol *s,int argc,t_atom *argv)

{
  char cVar1;
  word wVar2;
  int iVar3;
  t_object *owner;
  _binbuf *p_Var4;
  _outlet *gp;
  _outlet *p_Var5;
  word *pwVar6;
  int iVar7;
  int iVar8;
  t_atom defarg;
  t_float local_8c;
  word local_88;
  undefined4 uStack_80;
  
  owner = (t_object *)pd_new(pipe_class);
  if (argc == 0) {
    iVar8 = 0;
    local_8c = 0.0;
  }
  else {
    if (argv[(long)argc + -1].a_type == A_FLOAT) {
      local_8c = argv[(long)argc + -1].a_w.w_float;
    }
    else {
      atom_string(argv + (long)argc + -1,(char *)&local_88.w_index,0x4f);
      pd_error(owner,"pipe: %s: bad time delay value",&local_88);
      local_8c = 0.0;
    }
    iVar8 = argc + -1;
  }
  if (iVar8 == 0) {
    argv = (t_atom *)&local_88;
    local_88.w_float = 1.4013e-45;
    uStack_80 = 0;
    iVar8 = 1;
  }
  *(int *)&owner[1].te_g.g_pd = iVar8;
  p_Var4 = (_binbuf *)getbytes((long)iVar8 * 0x18);
  owner[1].te_binbuf = p_Var4;
  pwVar6 = (word *)((long)argv + 8);
  iVar3 = 0;
  iVar7 = iVar8;
  do {
    if (((t_atom *)(pwVar6 + -1))->a_type == A_SYMBOL) {
      iVar3 = iVar3 + (uint)(*pwVar6->w_symbol->s_name == 'p');
    }
    iVar7 = iVar7 + -1;
    pwVar6 = pwVar6 + 2;
  } while (iVar7 != 0);
  gp = (_outlet *)getbytes((long)iVar3 * 0x18);
  owner[1].te_outlet = gp;
  *(int *)((long)&owner[1].te_g.g_pd + 4) = iVar3;
  if (0 < iVar8) {
    pwVar6 = (word *)&p_Var4->b_vec;
    iVar7 = 0;
    do {
      if (*(int *)argv == 2) {
        cVar1 = *((word *)((long)argv + 8))->w_symbol->s_name;
        if (cVar1 == 'f') {
LAB_00190cf9:
          pwVar6[-1].w_float = 1.4013e-45;
          pwVar6->w_float = 0.0;
          goto LAB_00190d08;
        }
        if (cVar1 == 'p') {
          pwVar6[-1].w_float = 4.2039e-45;
          pwVar6->w_gpointer = (t_gpointer *)gp;
          gpointer_init((t_gpointer *)gp);
          p_Var5 = outlet_new(owner,&s_pointer);
          pwVar6[1].w_symbol = (t_symbol *)p_Var5;
          if (iVar7 != 0) {
            pointerinlet_new(owner,(t_gpointer *)gp);
          }
          gp = (_outlet *)&gp->o_sym;
        }
        else {
          if (cVar1 != 's') {
            pd_error(owner,"pipe: %s: bad type");
            goto LAB_00190cf9;
          }
          pwVar6[-1].w_float = 2.8026e-45;
          pwVar6->w_symbol = &s_symbol;
          p_Var5 = outlet_new(owner,&s_symbol);
          pwVar6[1].w_symbol = (t_symbol *)p_Var5;
          if (iVar7 != 0) {
            symbolinlet_new(owner,&pwVar6->w_symbol);
          }
        }
      }
      else {
        if (*(int *)argv != 1) goto LAB_00190d2b;
        wVar2 = *(word *)((long)argv + 8);
        pwVar6[-1] = *(word *)argv;
        *pwVar6 = wVar2;
LAB_00190d08:
        p_Var5 = outlet_new(owner,&s_float);
        pwVar6[1].w_symbol = (t_symbol *)p_Var5;
        if (iVar7 != 0) {
          floatinlet_new(owner,&pwVar6->w_float);
        }
      }
LAB_00190d2b:
      iVar7 = iVar7 + 1;
      argv = (t_atom *)((long)argv + 0x10);
      pwVar6 = pwVar6 + 3;
    } while (iVar8 != iVar7);
  }
  floatinlet_new(owner,(t_float *)&owner[1].te_g.g_next);
  owner[1].te_inlet = (_inlet *)0x0;
  *(t_float *)&owner[1].te_g.g_next = local_8c;
  return owner;
}

Assistant:

static void *pipe_new(t_symbol *s, int argc, t_atom *argv)
{
    t_pipe *x = (t_pipe *)pd_new(pipe_class);
    t_atom defarg, *ap;
    t_pipeout *vec, *vp;
    t_gpointer *gp;
    int nptr = 0;
    int i;
    t_float deltime;
    if (argc)
    {
        if (argv[argc-1].a_type != A_FLOAT)
        {
            char stupid[80];
            atom_string(&argv[argc-1], stupid, 79);
            pd_error(x, "pipe: %s: bad time delay value", stupid);
            deltime = 0;
        }
        else deltime = argv[argc-1].a_w.w_float;
        argc--;
    }
    else deltime = 0;
    if (!argc)
    {
        argv = &defarg;
        argc = 1;
        SETFLOAT(&defarg, 0);
    }
    x->x_n = argc;
    vec = x->x_vec = (t_pipeout *)getbytes(argc * sizeof(*x->x_vec));

    for (i = argc, ap = argv; i--; ap++)
        if (ap->a_type == A_SYMBOL && *ap->a_w.w_symbol->s_name == 'p')
            nptr++;

    gp = x->x_gp = (t_gpointer *)t_getbytes(nptr * sizeof (*gp));
    x->x_nptr = nptr;

    for (i = 0, vp = vec, ap = argv; i < argc; i++, ap++, vp++)
    {
        if (ap->a_type == A_FLOAT)
        {
            vp->p_atom = *ap;
            vp->p_outlet = outlet_new(&x->x_obj, &s_float);
            if (i) floatinlet_new(&x->x_obj, &vp->p_atom.a_w.w_float);
        }
        else if (ap->a_type == A_SYMBOL)
        {
            char c = *ap->a_w.w_symbol->s_name;
            if (c == 's')
            {
                SETSYMBOL(&vp->p_atom, &s_symbol);
                vp->p_outlet = outlet_new(&x->x_obj, &s_symbol);
                if (i) symbolinlet_new(&x->x_obj, &vp->p_atom.a_w.w_symbol);
            }
            else if (c == 'p')
            {
                vp->p_atom.a_type = A_POINTER;
                vp->p_atom.a_w.w_gpointer = gp;
                gpointer_init(gp);
                vp->p_outlet = outlet_new(&x->x_obj, &s_pointer);
                if (i) pointerinlet_new(&x->x_obj, gp);
                gp++;
            }
            else
            {
                if (c != 'f') pd_error(x, "pipe: %s: bad type",
                    ap->a_w.w_symbol->s_name);
                SETFLOAT(&vp->p_atom, 0);
                vp->p_outlet = outlet_new(&x->x_obj, &s_float);
                if (i) floatinlet_new(&x->x_obj, &vp->p_atom.a_w.w_float);
            }
        }
    }
    floatinlet_new(&x->x_obj, &x->x_deltime);
    x->x_hang = 0;
    x->x_deltime = deltime;
    return (x);
}